

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

void __thiscall
CVmDynamicFunc::load_image_data(CVmDynamicFunc *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  CVmVarHeap *pCVar4;
  vm_dynfunc_ext *this_00;
  char *__dest;
  void *in_RDX;
  vm_val_t *in_RDI;
  int i;
  vm_dynfunc_ext *ext;
  int obj_ref_cnt;
  size_t bytecode_len;
  vm_obj_id_t obj;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  void *local_18;
  
  if ((in_RDI->val).ptr != (void *)0x0) {
    pCVar4 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar4->_vptr_CVmVarHeap[6])(pCVar4,(in_RDI->val).ptr);
  }
  iVar1 = ::osrp2(in_RDX);
  iVar2 = ::osrp2((void *)((long)in_RDX + 2));
  this_00 = vm_dynfunc_ext::alloc_ext
                      ((CVmDynamicFunc *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  (in_RDI->val).native_desc = (CVmNativeCodeDesc *)this_00;
  vmb_get_dh((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  vmb_get_dh((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  obj = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  vm_dynfunc_ext::get_prefix_ptr(this_00);
  vmb_put_objid((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),obj);
  __dest = vm_dynfunc_ext::get_bytecode_ptr((vm_dynfunc_ext *)0x2db767);
  memcpy(__dest,(void *)((long)in_RDX + 0xe),(long)iVar1);
  local_18 = (void *)((long)iVar1 + (long)in_RDX + 0xe);
  for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
    uVar3 = ::osrp2(local_18);
    this_00->obj_refs[iVar1] = uVar3;
    local_18 = (void *)((long)local_18 + 2);
  }
  return;
}

Assistant:

void CVmDynamicFunc::load_image_data(VMG_ vm_obj_id_t self,
                                     const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bytecode length */
    size_t bytecode_len = osrp2(ptr);
    ptr += 2;

    /* read the object reference count */
    int obj_ref_cnt = osrp2(ptr);
    ptr += 2;

    /* allocate the extension */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);
    ext_ = (char *)ext;

    /* save the method context object */
    vmb_get_dh(ptr, &ext->method_ctx);
    ptr += VMB_DATAHOLDER;

    /* save the source string value */
    vmb_get_dh(ptr, &ext->src);
    ptr += VMB_DATAHOLDER;

    /* set up the dynamic code prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);

    /* copy the byte code */
    memcpy(ext->get_bytecode_ptr(), ptr, bytecode_len);
    ptr += bytecode_len;

    /* load the object reference offsets */
    for (int i = 0 ; i < obj_ref_cnt ; ++i, ptr += 2)
        ext->obj_refs[i] = osrp2(ptr);
}